

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O1

_Bool Curl_auth_user_contains_domain(char *user)

{
  char *pcVar1;
  size_t sVar2;
  
  if (user == (char *)0x0) {
    return false;
  }
  if ((*user != '\0') && (pcVar1 = strpbrk(user,"\\/@"), user < pcVar1)) {
    sVar2 = strlen(user);
    return pcVar1 < user + (sVar2 - 1);
  }
  return false;
}

Assistant:

bool Curl_auth_user_contains_domain(const char *user)
{
  bool valid = FALSE;

  if(user && *user) {
    /* Check we have a domain name or UPN present */
    char *p = strpbrk(user, "\\/@");

    valid = (p != NULL && p > user && p < user + strlen(user) - 1 ? TRUE :
                                                                    FALSE);
  }
#if defined(HAVE_GSSAPI) || defined(USE_WINDOWS_SSPI)
  else
    /* User and domain are obtained from the GSS-API credientials cache or the
       currently logged in user from Windows */
    valid = TRUE;
#endif

  return valid;
}